

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O2

void __thiscall
bk_lib::pod_vector<Clasp::UncoreMinimize::LitData,_std::allocator<Clasp::UncoreMinimize::LitData>_>
::append_realloc(pod_vector<Clasp::UncoreMinimize::LitData,_std::allocator<Clasp::UncoreMinimize::LitData>_>
                 *this,size_type n,LitData *x)

{
  size_type *psVar1;
  pointer __src;
  size_type sVar2;
  LitData *__dest;
  
  sVar2 = grow_size(this,n);
  __dest = __gnu_cxx::new_allocator<Clasp::UncoreMinimize::LitData>::allocate
                     ((new_allocator<Clasp::UncoreMinimize::LitData> *)this,(ulong)sVar2,(void *)0x0
                     );
  __src = (this->ebo_).buf;
  if (__src != (pointer)0x0) {
    memcpy(__dest,__src,(ulong)(this->ebo_).size << 3);
  }
  detail::fill<Clasp::UncoreMinimize::LitData>
            (__dest + (this->ebo_).size,__dest + (this->ebo_).size + n,x);
  ebo::release(&this->ebo_);
  (this->ebo_).buf = __dest;
  (this->ebo_).cap = sVar2;
  psVar1 = &(this->ebo_).size;
  *psVar1 = *psVar1 + n;
  return;
}

Assistant:

void append_realloc(size_type n, const T& x) {
		size_type new_cap = grow_size(n);
		pointer temp      = ebo_.allocate(new_cap);
		if (ebo_.buf) {
			std::memcpy(temp, ebo_.buf, size()*sizeof(T));
		}
		detail::fill(temp+size(), temp+size()+n, x);
		ebo_.release();
		ebo_.buf  = temp;
		ebo_.cap  = new_cap;
		ebo_.size+= n;
	}